

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

void helper_lam(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  uint32_t uVar1;
  uintptr_t unaff_retaddr;
  
  if ((a2 & 3) != 0) {
    tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
  }
  while( true ) {
    uVar1 = cpu_ldl_data_ra_s390x(env,a2,unaff_retaddr);
    env->aregs[(int)r1] = uVar1;
    if (r1 == r3) break;
    a2 = a2 + 4;
    r1 = (int)(r1 + 1) % 0x10;
  }
  return;
}

Assistant:

void HELPER(lam)(CPUS390XState *env, uint32_t r1, uint64_t a2, uint32_t r3)
{
    uintptr_t ra = GETPC();
    int i;

    if (a2 & 0x3) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    for (i = r1;; i = (i + 1) % 16) {
        env->aregs[i] = cpu_ldl_data_ra(env, a2, ra);
        a2 += 4;

        if (i == r3) {
            break;
        }
    }
}